

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

void __thiscall wallet::RecordHeader::Unserialize<AutoFile>(RecordHeader *this,AutoFile *s)

{
  long lVar1;
  RecordType RVar2;
  uint16_t uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = ser_readdata16<AutoFile>(s);
  this->len = uVar3;
  RVar2 = ser_readdata8<AutoFile>(s);
  this->type = RVar2 & ~DELETE;
  this->deleted = (bool)(RVar2 >> 7);
  if (this->other_endian == true) {
    this->len = this->len << 8 | this->len >> 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> len;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<RecordType>(uint8_type & ~static_cast<uint8_t>(RecordType::DELETE));
        deleted = uint8_type & static_cast<uint8_t>(RecordType::DELETE);

        if (other_endian) {
            len = internal_bswap_16(len);
        }
    }